

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void plot_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey,
             int tovis)

{
  double dVar1;
  undefined8 uVar2;
  _fielddesc *p_Var3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _glist *p_Var7;
  _glist *extraout_RAX;
  long extraout_RAX_00;
  _glist *extraout_RAX_01;
  _glist *extraout_RAX_02;
  _parentwidgetbehavior *p_Var8;
  _glist *extraout_RAX_03;
  _glist *p_Var9;
  _glist *extraout_RAX_04;
  int iVar10;
  int i;
  _glist *p_Var11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  t_gobj *ptVar16;
  long lVar17;
  t_template *ptVar18;
  t_word *ptVar19;
  undefined1 *puVar20;
  bool bVar21;
  t_float tVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double local_4238;
  t_float yloc;
  char *local_4228;
  int elemsize;
  t_template *local_4218;
  _glist *local_4210;
  float local_4204;
  float local_4200;
  t_float xinc;
  undefined1 local_41f8 [16];
  _fielddesc *local_41e8;
  double local_41e0;
  _fielddesc *local_41d8;
  t_float xloc;
  t_float linewidth;
  undefined1 local_41c8 [16];
  undefined1 *local_41b0;
  undefined1 *local_41a8;
  char *local_41a0;
  _glist *local_4198;
  int local_418c;
  _glist *local_4188;
  double local_4180;
  t_float scalarvis;
  _glist *local_4170;
  ulong local_4168;
  t_float vis;
  t_float style;
  int xonset;
  int wonset;
  int yonset;
  undefined1 local_4148 [16];
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  char *tags [3];
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_float edit;
  char tag0 [80];
  char tag [80];
  t_word coordinates [2048];
  
  local_4210 = (_glist *)CONCAT44(local_4210._4_4_,basex);
  tags[0] = tag;
  tags[1] = tag0;
  tags[2] = "array";
  local_41f8._8_8_ = local_41f8._0_8_;
  local_41f8._0_8_ = data;
  local_4218 = template;
  local_41d8 = (_fielddesc *)z;
  local_418c = tovis;
  local_4170 = glist;
  iVar5 = plot_readownertemplate
                    ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,&yloc,
                     &style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
  if (iVar5 != 0) {
    return;
  }
  if (((local_418c != 0) && (vis == 0.0)) && (!NAN(vis))) {
    return;
  }
  iVar5 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc,
                          yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
  if (iVar5 != 0) {
    return;
  }
  local_4198 = (_glist *)(ulong)(uint)array->a_n;
  pcVar15 = array->a_vec;
  uVar2 = local_41f8._0_8_;
  sprintf(tag,"plot%lx",local_41f8._0_8_);
  uVar14 = (ulong)(uint)wonset;
  ptVar18 = (t_template *)(ulong)(uint)xonset;
  local_4188 = (_glist *)(ulong)(uint)yonset;
  local_41a0 = pcVar15;
  iVar5 = sprintf(tag0,"plot%lx_array%lx_onset%+d%+d%+d",uVar2,pcVar15,uVar14,ptVar18,local_4188);
  p_Var9 = local_4170;
  p_Var7 = (_glist *)CONCAT44(extraout_var,iVar5);
  if ((local_4170->field_0xe9 & 1) != 0) {
    iVar5 = glist_getzoom(local_4170);
    p_Var7 = (_glist *)CONCAT44(extraout_var_00,iVar5);
    linewidth = (float)iVar5 * linewidth;
  }
  p_Var11 = local_4198;
  iVar5 = (int)local_4198;
  if (local_418c == 0) {
    if (((scalarvis != 0.0) || (NAN(scalarvis))) && (0 < iVar5)) {
      p_Var7 = (_glist *)(long)elemsize;
      p_Var11 = (_glist *)0x0;
      local_4210 = p_Var7;
      do {
        ptVar16 = elemtemplatecanvas->gl_list;
        if (ptVar16 != (t_gobj *)0x0) {
          pcVar15 = local_41a0 + (long)p_Var11 * (long)local_4210;
          do {
            p_Var7 = (_glist *)pd_getparentwidget(&ptVar16->g_pd);
            if (p_Var7 != (_glist *)0x0) {
              p_Var7 = (_glist *)
                       (*(code *)(p_Var7->gl_obj).te_inlet)
                                 (0,0,ptVar16,p_Var9,pcVar15,elemtemplate,0);
            }
            ptVar16 = ptVar16->g_next;
          } while (ptVar16 != (_gobj *)0x0);
        }
        p_Var11 = (_glist *)((long)&(p_Var11->gl_obj).te_g.g_pd + 1);
      } while (p_Var11 != local_4198);
    }
    p_Var9 = glist_getcanvas(p_Var7);
    pdgui_vmess((char *)0x0,"crs",p_Var9,"delete",tag);
    return;
  }
  local_4200 = style;
  tVar22 = fielddesc_getfloat((_fielddesc *)&((t_gobj *)((long)local_41d8 + 0x30))->g_next,
                              local_4218,(t_word *)local_41f8._0_8_,1);
  uVar13 = 0;
  if (0 < (int)tVar22) {
    uVar13 = (ulong)(uint)(int)tVar22;
  }
  uVar12 = (uint)(uVar13 * 0x66666667 >> 0x20);
  uVar6 = (uint)(uVar13 * 0x51eb851f >> 0x20) & 0x3fffffe0;
  if (0xfe < uVar6) {
    uVar6 = 0xff;
  }
  iVar10 = ((uVar12 >> 2) + (int)((uVar13 * 0x66666667) / 0x2800000000) * -10) * 0x20;
  if (0xfe < iVar10) {
    iVar10 = 0xff;
  }
  uVar12 = ((int)uVar13 + ((uVar12 >> 2) + (uVar12 >> 2)) * -5) * 0x20;
  if (0xfe < (int)uVar12) {
    uVar12 = 0xff;
  }
  local_4168 = (ulong)(uVar12 | uVar6 << 0x10 | iVar10 << 8);
  tVar22 = 0.0;
  local_41d8 = yfielddesc;
  local_41e8 = xfielddesc;
  local_4218 = ptVar18;
  if ((local_4200 == 0.0) && (!NAN(local_4200))) {
    if (0 < iVar5) {
      local_4200 = xloc + local_4210._0_4_;
      local_4228 = (char *)(double)local_4200;
      dVar1 = (double)xinc;
      local_41e0 = (double)(long)elemsize;
      local_4204 = yloc;
      local_41b0 = (undefined1 *)(ulong)((int)local_4198 - 1);
      local_4180 = (double)CONCAT44(local_4180._4_4_,linewidth);
      local_41a8 = (undefined1 *)((long)&local_4198[-1].gl_privatedata + 7);
      fVar23 = -1e+20;
      iVar5 = 0;
      pcVar15 = local_41a0;
      puVar20 = (undefined1 *)0x0;
      fVar25 = 1e+20;
      do {
        p_Var3 = local_41e8;
        local_41c8._0_4_ = fVar23;
        local_41f8._0_4_ = iVar5;
        if ((int)ptVar18 < 0) {
          fVar23 = (float)(double)local_4228;
          local_4228 = (char *)((double)local_4228 + dVar1);
          tVar22 = fielddesc_cvttocoord(local_41e8,fVar23);
          tVar22 = glist_xtopixels(p_Var9,tVar22);
          uVar6 = (uint)tVar22;
          tVar22 = fielddesc_cvttocoord(p_Var3,(float)(double)local_4228);
          tVar22 = glist_xtopixels(p_Var9,tVar22);
          uVar12 = (uint)tVar22;
        }
        else {
          tVar22 = fielddesc_cvttocoord(local_41e8,*(float *)(pcVar15 + (long)ptVar18) + local_4200)
          ;
          tVar22 = glist_xtopixels(p_Var9,tVar22);
          uVar6 = (uint)tVar22;
          uVar12 = uVar6 + 2;
        }
        fVar23 = 0.0;
        if (-1 < (int)local_4188) {
          fVar23 = *(float *)(pcVar15 + (long)local_4188) + local_4204;
        }
        if (1e+20 <= ABS(fVar23)) {
          fVar23 = 0.0;
        }
        fVar24 = fVar23;
        if (fVar25 <= fVar23) {
          fVar24 = fVar25;
        }
        if (fVar23 <= (float)local_41c8._0_4_) {
          fVar23 = (float)local_41c8._0_4_;
        }
        if ((local_41b0 == puVar20) || (uVar12 != uVar6)) {
          local_4148 = ZEXT416((uint)fVar23);
          local_41c8._0_4_ = fVar24;
          p_Var7 = glist_getcanvas(local_4188);
          p_Var3 = local_41d8;
          tVar22 = fielddesc_cvttocoord(local_41d8,(t_float)local_41c8._0_4_);
          tVar22 = glist_ytopixels(p_Var9,tVar22 + basey);
          auVar4 = local_41c8;
          ptVar18 = local_4218;
          local_41c8._4_4_ = 0;
          local_41c8._0_4_ = (int)tVar22;
          local_41c8._8_8_ = auVar4._8_8_;
          tVar22 = fielddesc_cvttocoord(p_Var3,(t_float)local_4148._0_4_);
          tVar22 = glist_ytopixels(p_Var9,tVar22 + basey);
          pdgui_vmess((char *)0x0,"crr iiii rk rf rS",0,p_Var7,"create","rectangle",(ulong)uVar6,
                      local_41c8._0_8_,(ulong)uVar12,(ulong)(uint)(int)(tVar22 + local_4180._0_4_),
                      "-fill",local_4168,"-width","-tags",3,tags);
          iVar5 = local_41f8._0_4_ + 1;
          fVar23 = -1e+20;
          fVar24 = 1e+20;
        }
        else {
          iVar5 = local_41f8._0_4_;
        }
        if (2000 < iVar5) break;
        pcVar15 = pcVar15 + (long)local_41e0;
        bVar21 = local_41a8 != puVar20;
        puVar20 = puVar20 + 1;
        fVar25 = fVar24;
      } while (bVar21);
    }
    goto LAB_0015ab6c;
  }
  if (wonset < 0) {
    local_41a8 = (undefined1 *)CONCAT44(local_41a8._4_4_,linewidth);
    if (linewidth <= 0.0) goto LAB_0015ab6c;
    if ((int)local_4198 < 1) {
      fVar25 = 10.0;
      uVar12 = 0;
      p_Var7 = local_4198;
    }
    else {
      local_4228 = (char *)CONCAT44(local_4228._4_4_,xloc);
      local_4238 = (double)xloc;
      local_41e0 = (double)xinc;
      local_41c8._0_8_ = (long)elemsize;
      local_41b0 = (undefined1 *)CONCAT44(local_41b0._4_4_,yloc + basey);
      uVar12 = 0;
      pcVar15 = local_41a0;
      iVar5 = -1;
      p_Var7 = local_4198;
      do {
        p_Var7 = (_glist *)((long)&p_Var7[-1].gl_privatedata + 7);
        if ((int)local_4218 < 0) {
          tVar22 = (t_float)local_4238;
          local_4238 = local_4238 + local_41e0;
        }
        else {
          tVar22 = *(float *)(pcVar15 + (long)local_4218) + local_4228._0_4_;
        }
        fVar25 = 0.0;
        if (-1 < (int)local_4188) {
          fVar25 = *(float *)(pcVar15 + (long)local_4188);
        }
        if (1e+20 <= ABS(fVar25)) {
          fVar25 = 0.0;
        }
        local_41f8 = ZEXT416((uint)fVar25);
        tVar22 = fielddesc_cvttocoord(local_41e8,tVar22);
        tVar22 = glist_xtopixels(p_Var9,tVar22 + local_4210._0_4_);
        iVar10 = (int)(tVar22 + 0.5);
        if ((-1 < (int)local_4218) || (lVar17 = extraout_RAX_00, iVar5 != iVar10)) {
          coordinates[(int)(uVar12 * 2)].w_float = (float)iVar10;
          tVar22 = fielddesc_cvttocoord(local_41d8,(t_float)local_41f8._0_4_);
          tVar22 = glist_ytopixels(p_Var9,tVar22 + local_41b0._0_4_);
          lVar17 = (long)(int)(uVar12 * 2 + 1);
          coordinates[lVar17].w_float = tVar22;
          uVar12 = uVar12 + 1;
        }
        if ((uVar12 & 0x7ffffc00) != 0) break;
        pcVar15 = pcVar15 + local_41c8._0_8_;
        iVar5 = iVar10;
      } while (p_Var7 != (_glist *)0x0);
      fVar25 = (float)(iVar10 + 10);
      p_Var7 = (_glist *)CONCAT71((int7)((ulong)lVar17 >> 8),p_Var7 == (_glist *)0x0);
      tVar22 = (t_float)local_41f8._0_4_;
    }
    ptVar18 = local_4218;
    if (uVar12 == 1) {
      local_41f8._0_4_ = yloc + basey;
      coordinates[2]._0_4_ = fVar25;
      tVar22 = fielddesc_cvttocoord(local_41d8,tVar22);
      coordinates[3]._0_4_ = glist_ytopixels(p_Var9,tVar22 + (float)local_41f8._0_4_);
      uVar12 = 2;
      p_Var7 = extraout_RAX_03;
    }
    if (uVar12 == 0) goto LAB_0015ab6c;
    p_Var9 = glist_getcanvas(p_Var7);
    pdgui_vmess((char *)0x0,"crr iiii rf rk ri rS",SUB84((double)local_41a8._0_4_,0),p_Var9,"create"
                ,"line",0,0,0,0,"-width","-fill",local_4168,"-smooth",
                (ulong)(-(uint)(local_4200 == 2.0) & 1),"-tags",3,tags);
    p_Var7 = extraout_RAX_04;
  }
  else {
    local_4148._0_8_ = wfielddesc;
    local_41b0 = (undefined1 *)CONCAT44(local_41b0._4_4_,xloc);
    local_4228 = (char *)(double)xloc;
    if (iVar5 < 1) {
      local_41c8 = ZEXT816(0);
      uVar12 = 0;
      local_41f8 = ZEXT816(0);
      iVar5 = 0;
    }
    else {
      local_4180 = (double)xinc;
      local_41e0 = (double)(long)elemsize;
      local_4204 = yloc + basey;
      uVar12 = 0;
      pcVar15 = local_41a0;
      iVar10 = -1;
      do {
        if ((int)local_4218 < 0) {
          tVar22 = (t_float)(double)local_4228;
          local_4228 = (char *)((double)local_4228 + local_4180);
        }
        else {
          tVar22 = *(float *)(pcVar15 + (long)local_4218) + local_41b0._0_4_;
        }
        fVar25 = 0.0;
        if (-1 < (int)local_4188) {
          fVar25 = *(float *)(pcVar15 + (long)local_4188);
        }
        if (1e+20 <= ABS(fVar25)) {
          fVar25 = 0.0;
        }
        local_41c8 = ZEXT416((uint)fVar25);
        local_41f8 = ZEXT416((uint)*(float *)(pcVar15 + uVar14));
        if (1e+20 <= ABS(*(float *)(pcVar15 + uVar14))) {
          local_41f8 = ZEXT816(0);
        }
        tVar22 = fielddesc_cvttocoord(local_41e8,tVar22);
        tVar22 = glist_xtopixels(p_Var9,tVar22 + local_4210._0_4_);
        iVar5 = (int)(tVar22 + 0.5);
        if ((-1 < (int)local_4218) || (p_Var7 = extraout_RAX, iVar10 != iVar5)) {
          coordinates[(int)(uVar12 * 2)].w_float = (float)iVar5;
          tVar22 = fielddesc_cvttocoord(local_41d8,(t_float)local_41c8._0_4_);
          local_41a8 = (undefined1 *)CONCAT44(local_41a8._4_4_,tVar22 + local_4204);
          tVar22 = fielddesc_cvttocoord((_fielddesc *)local_4148._0_8_,(t_float)local_41f8._0_4_);
          tVar22 = glist_ytopixels(p_Var9,local_41a8._0_4_ - tVar22);
          p_Var7 = (_glist *)(long)(int)(uVar12 * 2 + 1);
          coordinates[(long)p_Var7].w_float = tVar22;
          uVar12 = uVar12 + 1;
        }
        if ((uVar12 & 0x7ffffc00) != 0) goto LAB_0015aa7a;
        pcVar15 = pcVar15 + (long)local_41e0;
        p_Var11 = (_glist *)((long)&p_Var11[-1].gl_privatedata + 7);
        iVar10 = iVar5;
      } while (p_Var11 != (_glist *)0x0);
    }
    p_Var7 = local_4198;
    if (0 < (int)local_4198) {
      local_4180 = (double)xinc;
      local_4204 = yloc + basey;
      ptVar16 = (t_gobj *)((long)&(local_4198->gl_obj).te_g.g_pd + 1);
      pcVar15 = local_41a0 + (long)((long)&local_4198[-1].gl_privatedata + 7) * (long)elemsize;
      local_41e0 = (double)-(long)elemsize;
      iVar10 = -1;
      do {
        if ((int)local_4218 < 0) {
          local_4228 = (char *)((double)local_4228 - local_4180);
          tVar22 = (t_float)(double)local_4228;
        }
        else {
          tVar22 = *(float *)(pcVar15 + (long)local_4218) + local_41b0._0_4_;
        }
        fVar25 = 0.0;
        if (-1 < (int)local_4188) {
          fVar25 = *(float *)(pcVar15 + (long)local_4188);
        }
        if (1e+20 <= ABS(fVar25)) {
          fVar25 = 0.0;
        }
        local_41c8 = ZEXT416((uint)fVar25);
        local_41f8 = ZEXT416((uint)*(float *)(pcVar15 + uVar14));
        if (1e+20 <= ABS(*(float *)(pcVar15 + uVar14))) {
          local_41f8 = ZEXT816(0);
        }
        tVar22 = fielddesc_cvttocoord(local_41e8,tVar22);
        tVar22 = glist_xtopixels(p_Var9,tVar22 + local_4210._0_4_);
        iVar5 = (int)(tVar22 + 0.5);
        if ((-1 < (int)local_4218) || (p_Var7 = extraout_RAX_01, iVar10 != iVar5)) {
          coordinates[(int)(uVar12 * 2)].w_float = (float)iVar5;
          tVar22 = fielddesc_cvttocoord(local_41d8,(t_float)local_41c8._0_4_);
          local_41a8 = (undefined1 *)CONCAT44(local_41a8._4_4_,tVar22 + local_4204);
          tVar22 = fielddesc_cvttocoord((_fielddesc *)local_4148._0_8_,(t_float)local_41f8._0_4_);
          tVar22 = glist_ytopixels(p_Var9,tVar22 + local_41a8._0_4_);
          p_Var7 = (_glist *)(long)(int)(uVar12 * 2 + 1);
          coordinates[(long)p_Var7].w_float = tVar22;
          uVar12 = uVar12 + 1;
        }
        if ((uVar12 & 0x7ffffc00) != 0) goto LAB_0015aa7a;
        ptVar16 = (t_gobj *)((long)(ptVar16 + 0xffffffffffffffff) + 0xf);
        pcVar15 = pcVar15 + (long)local_41e0;
        iVar10 = iVar5;
      } while (1 < (long)ptVar16);
    }
    p_Var3 = local_41d8;
    if ((int)uVar12 < 4) {
      local_41e8 = (_fielddesc *)CONCAT44(local_41e8._4_4_,(float)(iVar5 + 10));
      coordinates[(int)(uVar12 * 2)].w_float = (float)(iVar5 + 10);
      fVar25 = yloc + basey;
      tVar22 = fielddesc_cvttocoord(local_41d8,(t_float)local_41c8._0_4_);
      local_4228 = (char *)CONCAT44(local_4228._4_4_,tVar22 + fVar25);
      uVar2 = local_4148._0_8_;
      tVar22 = fielddesc_cvttocoord((_fielddesc *)local_4148._0_8_,(t_float)local_41f8._0_4_);
      tVar22 = glist_ytopixels(p_Var9,local_4228._0_4_ - tVar22);
      coordinates[(int)(uVar12 * 2 + 1)].w_float = tVar22;
      coordinates[(int)(uVar12 * 2 + 2)].w_index = (int)local_41e8;
      tVar22 = fielddesc_cvttocoord(p_Var3,(t_float)local_41c8._0_4_);
      local_41c8._0_4_ = tVar22 + fVar25;
      tVar22 = fielddesc_cvttocoord((_fielddesc *)uVar2,(t_float)local_41f8._0_4_);
      tVar22 = glist_ytopixels(p_Var9,tVar22 + (float)local_41c8._0_4_);
      p_Var7 = (_glist *)(long)(int)(uVar12 * 2 + 3);
      coordinates[(long)p_Var7].w_float = tVar22;
      uVar12 = uVar12 + 2;
    }
LAB_0015aa7a:
    p_Var7 = glist_getcanvas(p_Var7);
    uVar14 = 1;
    if ((p_Var9->field_0xe9 & 1) != 0) {
      uVar6 = glist_getzoom(p_Var9);
      uVar14 = (ulong)uVar6;
    }
    pdgui_vmess((char *)0x0,"crr ri rk rk ri rS",p_Var7,"create","polygon","-width",uVar14,"-fill",
                local_4168,"-outline",local_4168,"-smooth",(ulong)(-(uint)(local_4200 == 2.0) & 1),
                "-tags",3,tags);
    p_Var7 = extraout_RAX_02;
  }
  p_Var9 = local_4170;
  p_Var7 = glist_getcanvas(p_Var7);
  pdgui_vmess((char *)0x0,"crs w",p_Var7,"coords",tag0,(ulong)(uVar12 * 2),coordinates);
  ptVar18 = local_4218;
LAB_0015ab6c:
  if (((scalarvis != 0.0) || (NAN(scalarvis))) && (0 < (int)local_4198)) {
    local_4238 = (double)xloc;
    local_41b0 = (undefined1 *)(double)xinc;
    local_41e0 = (double)local_4210._0_4_;
    local_4170 = (_glist *)CONCAT44(local_4170._4_4_,xloc + local_4210._0_4_);
    lVar17 = (long)elemsize;
    local_41e8 = (_fielddesc *)(local_41a0 + (long)ptVar18);
    local_4228 = local_41a0 + (long)&local_4188->gl_obj;
    local_41c8._0_8_ = elemtemplatecanvas;
    p_Var7 = (_glist *)0x0;
    do {
      if ((int)ptVar18 < 0) {
        local_41f8._0_4_ = (undefined4)(local_4238 + local_41e0);
        local_4238 = local_4238 + (double)local_41b0;
      }
      else {
        local_41f8._0_4_ = *(float *)((long)local_41e8 + (long)p_Var7 * lVar17) + local_4170._0_4_;
      }
      if ((int)local_4188 < 0) {
        tVar22 = 0.0;
      }
      else {
        tVar22 = *(t_float *)(local_4228 + (long)p_Var7 * lVar17);
      }
      tVar22 = fielddesc_cvttocoord(local_41d8,tVar22);
      local_4210 = (_glist *)CONCAT44(local_4210._4_4_,tVar22);
      ptVar16 = *(t_gobj **)(local_41c8._0_8_ + 0x30);
      if (ptVar16 != (t_gobj *)0x0) {
        local_4210 = (_glist *)CONCAT44(local_4210._4_4_,tVar22 + basey + yloc);
        ptVar19 = (t_word *)(local_41a0 + (long)p_Var7 * lVar17);
        do {
          p_Var8 = pd_getparentwidget(&ptVar16->g_pd);
          if (p_Var8 != (_parentwidgetbehavior *)0x0) {
            (*p_Var8->w_parentvisfn)
                      (ptVar16,p_Var9,ptVar19,elemtemplate,(t_float)local_41f8._0_4_,
                       local_4210._0_4_,local_418c);
          }
          ptVar16 = ptVar16->g_next;
        } while (ptVar16 != (_gobj *)0x0);
      }
      p_Var7 = (_glist *)((long)&(p_Var7->gl_obj).te_g.g_pd + 1);
      ptVar18 = local_4218;
    } while (p_Var7 != local_4198);
  }
  return;
}

Assistant:

static void plot_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int tovis)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset, i;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval,
        vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int nelem;
    char *elem;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
    char tag[80], tag0[80];
    const char*tags[] = {tag, tag0, "array"};
        /* even if the array is "invisible", if its visibility is
        set by an instance variable you have to explicitly erase it,
        because the flag could earlier have been on when we were getting
        drawn.  Rather than look to try to find out whether we're
        visible we just do the erasure.  At the TK level this should
        cause no action because the tag matches nobody.  LATER we
        might want to optimize this somehow.  Ditto the "vis()" routines
        for other drawing instructions. */

    if (plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) ||
            ((vis == 0) && tovis) /* see above for 'tovis' */
            || array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize, xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
                    return;
    nelem = array->a_n;
    elem = (char *)array->a_vec;

    sprintf(tag , "plot%lx", data);
        /* a tag that uniquely identifies the sub-plot */
    sprintf(tag0, "plot%lx_array%lx_onset%+d%+d%+d", data, elem, wonset, xonset, yonset);

    if (glist->gl_isgraph)
        linewidth *= glist_getzoom(glist);

    if (tovis)
    {
         /* we use t_word because pdgui_vmess() has a convenient FLOATWORDS type
          * FLOATARRAY is impractical (as it sends a list, and the GUI expects arguments)
          */
        t_word coordinates[1024*2];

        if (style == PLOTSTYLE_POINTS)
        {
            t_float minyval = 1e20, maxyval = -1e20;
            int ndrawn = 0;
            int color = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            for (xsum = basex + xloc, i = 0; i < nelem; i++)
            {
                t_float yval, xpix, ypix, nextxloc, usexloc;
                int ixpix, inextx;

                if (xonset >= 0)
                {
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = ixpix + 2;
                }
                else
                {
                    usexloc = xsum;
                    xsum += xinc;
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, xsum));
                }

                if (yonset >= 0)
                    yval = yloc + *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                yval = CLIP(yval);
                if (yval < minyval)
                    minyval = yval;
                if (yval > maxyval)
                    maxyval = yval;
                if (i == nelem-1 || inextx != ixpix)
                {

                    pdgui_vmess(0, "crr iiii rk rf rS",
                        glist_getcanvas(glist), "create", "rectangle",
                        ixpix , (int) glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, minyval)),
                        inextx, (int)(glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, maxyval)) + linewidth),
                        "-fill", color,
                        "-width", 0.,
                        "-tags", 3, tags);
                    ndrawn++;
                    minyval = 1e20;
                    maxyval = -1e20;
                }
                if (ndrawn > 2000) break;
            }
        }
        else
        {
            int outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));
            int lastpixel = -1, ndrawn = 0;
            t_float yval = 0, wval = 0, xpix;
            int ixpix = 0;
                /* draw the trace */


            if (wonset >= 0)
            {
                    /* found "w" field which controls linewidth.  The trace is
                    a filled polygon with 2n points. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            - fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }
                lastpixel = -1;
                for (i = nelem-1; i >= 0; i--)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else xsum -= xinc, usexloc = xsum;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            + fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }

                    /* TK will complain if there aren't at least 3 points.
                    There should be at least two already. */
                if (ndrawn < 4)
                {
                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        - fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;

                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        + fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;
                }
            ouch:

                pdgui_vmess(0, "crr ri rk rk ri rS",
                    glist_getcanvas(glist), "create", "polygon",
                    "-width", (glist->gl_isgraph ? glist_getzoom(glist) : 1),
                    "-fill", outline,
                    "-outline", outline,
                    "-smooth", (style == PLOTSTYLE_BEZ),
                    "-tags", 3, tags);

                pdgui_vmess(0, "crs w",
                    glist_getcanvas(glist), "coords", tag0,
                    ndrawn*2, coordinates);
            }
            else if (linewidth > 0)
            {
                    /* no "w" field.  If the linewidth is positive, draw a
                    segmented line with the requested width; otherwise don't
                    draw the trace at all. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);


                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates)) break;
                }

                    /* TK will complain if there aren't at least 2 points... */
                if (ndrawn == 1)
                {
                    coordinates[2].w_float = ixpix + 10;
                    coordinates[3].w_float = glist_ytopixels(glist, basey + yloc + fielddesc_cvttocoord(yfielddesc, yval));
                    ndrawn = 2;
                }

                if(ndrawn)
                {
                    pdgui_vmess(0, "crr iiii rf rk ri rS",
                        glist_getcanvas(glist), "create", "line",
                        0, 0, 0, 0,
                        "-width", linewidth,
                        "-fill", outline,
                        "-smooth", (style == PLOTSTYLE_BEZ),
                        "-tags", 3, tags);
                    pdgui_vmess(0, "crs w",
                        glist_getcanvas(glist), "coords", tag0,
                        ndrawn*2, coordinates);
                }
            }
        }
            /* We're done with the outline; now draw all the points.
            This code is inefficient since the template has to be
            searched for drawing instructions for every last point. */
        if (scalarvis != 0)
        {
            for (xsum = xloc, i = 0; i < nelem; i++)
            {
                t_float usexloc, useyloc;
                t_gobj *y;
                if (xonset >= 0)
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                useyloc = basey + yloc +
                    fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i),
                            elemtemplate, usexloc, useyloc, tovis);
                }
            }
        }
    }
    else
    {
            /* un-draw the individual points */
        if (scalarvis != 0)
        {
            int i;
            for (i = 0; i < nelem; i++)
            {
                t_gobj *y;
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i), elemtemplate,
                            0, 0, 0);
                }
            }
        }
            /* and then the trace */
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}